

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_ssse3.c
# Opt level: O1

void av1_highbd_wiener_convolve_add_src_ssse3
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  short sVar1;
  undefined2 *puVar9;
  ushort *puVar10;
  undefined2 *puVar11;
  undefined2 *puVar12;
  undefined2 *puVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  short sVar21;
  short sVar22;
  char cVar23;
  byte bVar24;
  undefined4 uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  undefined4 uVar35;
  undefined1 auVar33 [12];
  undefined4 uVar36;
  undefined1 auVar34 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  short local_8748;
  short sStack_8746;
  ushort auStack_8738 [128];
  undefined2 auStack_8638 [128];
  undefined1 auStack_8538 [256];
  undefined2 auStack_8438 [128];
  undefined1 auStack_8338 [256];
  undefined2 auStack_8238 [128];
  undefined1 auStack_8138 [256];
  undefined2 local_8038 [16388];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar49 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  cVar23 = (char)conv_params->round_0;
  bVar24 = (byte)bd;
  if (-7 < h) {
    iVar31 = (1 << (cVar23 - 1U & 0x1f)) + (1 << (bVar24 + 6 & 0x1f));
    uVar25 = *(undefined4 *)filter_x;
    auVar33._0_8_ = CONCAT26(filter_x[3] + 0x80,*(undefined6 *)filter_x);
    auVar33._8_2_ = filter_x[4];
    auVar33._10_2_ = filter_x[5];
    auVar37._12_2_ = filter_x[6];
    auVar37._0_12_ = auVar33;
    auVar37._14_2_ = filter_x[7];
    uVar35 = (undefined4)((ulong)auVar33._0_8_ >> 0x20);
    uVar36 = auVar33._8_4_;
    auVar55._12_4_ = auVar37._12_4_;
    auVar38._4_4_ = uVar25;
    auVar38._0_4_ = uVar25;
    auVar38._8_4_ = uVar25;
    auVar38._12_4_ = uVar25;
    auVar42._4_4_ = uVar35;
    auVar42._0_4_ = uVar35;
    auVar42._8_4_ = uVar35;
    auVar42._12_4_ = uVar35;
    auVar43._4_4_ = uVar36;
    auVar43._0_4_ = uVar36;
    auVar43._8_4_ = uVar36;
    auVar43._12_4_ = uVar36;
    auVar55._4_4_ = auVar55._12_4_;
    auVar55._0_4_ = auVar55._12_4_;
    auVar55._8_4_ = auVar55._12_4_;
    auVar37 = ZEXT416((uint)~(-1 << ((bVar24 - cVar23) + 8 & 0x1f)));
    auVar37 = pshuflw(auVar37,auVar37,0);
    uVar28 = 0;
    iVar26 = h + 6;
    if (h + 6 < 1) {
      iVar26 = 0;
    }
    lVar27 = (long)src8 * 2 + src_stride * -6 + 10;
    auVar40 = ZEXT416((uint)conv_params->round_0);
    do {
      if (0 < w) {
        lVar32 = 0;
        do {
          auVar53 = *(undefined1 (*) [16])(lVar27 + -0x10 + lVar32 * 2);
          auVar47 = *(undefined1 (*) [16])(lVar27 + lVar32 * 2);
          auVar14._16_16_ = auVar47;
          auVar14._0_16_ = auVar53;
          auVar15._16_16_ = auVar47;
          auVar15._0_16_ = auVar53;
          auVar58 = pmaddwd(auVar15._8_16_,auVar43);
          auVar16._16_16_ = auVar47;
          auVar16._0_16_ = auVar53;
          auVar64 = pmaddwd(auVar16._12_16_,auVar55);
          auVar17._16_16_ = auVar47;
          auVar17._0_16_ = auVar53;
          auVar18._16_16_ = auVar47;
          auVar18._0_16_ = auVar53;
          auVar19._16_16_ = auVar47;
          auVar19._0_16_ = auVar53;
          auVar20._16_16_ = auVar47;
          auVar20._0_16_ = auVar53;
          auVar53 = pmaddwd(auVar53,auVar38);
          auVar56 = pmaddwd(auVar14._4_16_,auVar42);
          auVar47._0_4_ =
               auVar53._0_4_ + iVar31 + auVar56._0_4_ + auVar64._0_4_ + auVar58._0_4_ >> auVar40;
          auVar47._4_4_ =
               auVar53._4_4_ + iVar31 + auVar56._4_4_ + auVar64._4_4_ + auVar58._4_4_ >> auVar40;
          auVar47._8_4_ =
               auVar53._8_4_ + iVar31 + auVar56._8_4_ + auVar64._8_4_ + auVar58._8_4_ >> auVar40;
          auVar47._12_4_ =
               auVar53._12_4_ + iVar31 + auVar56._12_4_ + auVar64._12_4_ + auVar58._12_4_ >> auVar40
          ;
          auVar56 = pmaddwd(auVar17._2_16_,auVar38);
          auVar64 = pmaddwd(auVar18._6_16_,auVar42);
          auVar65 = pmaddwd(auVar19._10_16_,auVar43);
          auVar53 = pmaddwd(auVar20._14_16_,auVar55);
          auVar58._0_4_ =
               auVar56._0_4_ + iVar31 + auVar65._0_4_ + auVar64._0_4_ + auVar53._0_4_ >> auVar40;
          auVar58._4_4_ =
               auVar56._4_4_ + iVar31 + auVar65._4_4_ + auVar64._4_4_ + auVar53._4_4_ >> auVar40;
          auVar58._8_4_ =
               auVar56._8_4_ + iVar31 + auVar65._8_4_ + auVar64._8_4_ + auVar53._8_4_ >> auVar40;
          auVar58._12_4_ =
               auVar56._12_4_ + iVar31 + auVar65._12_4_ + auVar64._12_4_ + auVar53._12_4_ >> auVar40
          ;
          auVar53 = packssdw(auVar47,auVar58);
          sVar1 = (ushort)(-1 < auVar53._0_2_) * auVar53._0_2_;
          sVar2 = (ushort)(-1 < auVar53._2_2_) * auVar53._2_2_;
          sVar3 = (ushort)(-1 < auVar53._4_2_) * auVar53._4_2_;
          sVar4 = (ushort)(-1 < auVar53._6_2_) * auVar53._6_2_;
          sVar5 = (ushort)(-1 < auVar53._8_2_) * auVar53._8_2_;
          sVar6 = (ushort)(-1 < auVar53._10_2_) * auVar53._10_2_;
          sVar7 = (ushort)(-1 < auVar53._12_2_) * auVar53._12_2_;
          sVar8 = (ushort)(-1 < auVar53._14_2_) * auVar53._14_2_;
          sVar21 = auVar37._0_2_;
          sVar22 = auVar37._2_2_;
          puVar10 = auStack_8738 + (ulong)((uint)uVar28 & 0x1ffffff) * 0x80 + lVar32;
          *puVar10 = (ushort)(sVar21 < sVar1) * sVar21 | (ushort)(sVar21 >= sVar1) * sVar1;
          puVar10[1] = (ushort)(sVar22 < sVar2) * sVar22 | (ushort)(sVar22 >= sVar2) * sVar2;
          puVar10[2] = (ushort)(sVar21 < sVar3) * sVar21 | (ushort)(sVar21 >= sVar3) * sVar3;
          puVar10[3] = (ushort)(sVar22 < sVar4) * sVar22 | (ushort)(sVar22 >= sVar4) * sVar4;
          puVar10[4] = (ushort)(sVar21 < sVar5) * sVar21 | (ushort)(sVar21 >= sVar5) * sVar5;
          puVar10[5] = (ushort)(sVar22 < sVar6) * sVar22 | (ushort)(sVar22 >= sVar6) * sVar6;
          puVar10[6] = (ushort)(sVar21 < sVar7) * sVar21 | (ushort)(sVar21 >= sVar7) * sVar7;
          puVar10[7] = (ushort)(sVar22 < sVar8) * sVar22 | (ushort)(sVar22 >= sVar8) * sVar8;
          lVar32 = lVar32 + 8;
        } while (lVar32 < w);
      }
      uVar28 = uVar28 + 1;
      lVar27 = lVar27 + src_stride * 2;
    } while (uVar28 != iVar26 + 1);
  }
  cVar23 = (char)conv_params->round_1;
  if (0 < h) {
    lVar27 = (long)dst8 * 2;
    iVar26 = (-1 << ((cVar23 + bVar24) - 1 & 0x1f)) + (1 << (cVar23 - 1U & 0x1f));
    uVar25 = *(undefined4 *)filter_y;
    auVar34._0_8_ = CONCAT26(filter_y[3] + 0x80,*(undefined6 *)filter_y);
    auVar34._8_2_ = filter_y[4];
    auVar34._10_2_ = filter_y[5];
    auVar56._12_2_ = filter_y[6];
    auVar56._0_12_ = auVar34;
    auVar56._14_2_ = filter_y[7];
    uVar35 = (undefined4)((ulong)auVar34._0_8_ >> 0x20);
    uVar36 = auVar34._8_4_;
    auVar64._12_4_ = auVar56._12_4_;
    auVar65._4_4_ = uVar25;
    auVar65._0_4_ = uVar25;
    auVar65._8_4_ = uVar25;
    auVar65._12_4_ = uVar25;
    auVar40._4_4_ = uVar35;
    auVar40._0_4_ = uVar35;
    auVar40._8_4_ = uVar35;
    auVar40._12_4_ = uVar35;
    auVar53._4_4_ = uVar36;
    auVar53._0_4_ = uVar36;
    auVar53._8_4_ = uVar36;
    auVar53._12_4_ = uVar36;
    auVar64._4_4_ = auVar64._12_4_;
    auVar64._0_4_ = auVar64._12_4_;
    auVar64._8_4_ = auVar64._12_4_;
    auVar38 = ZEXT416((uint)~(-1 << (bVar24 & 0x1f)));
    auVar38 = pshuflw(auVar38,auVar38,0);
    uVar28 = 0;
    do {
      if (0 < w) {
        uVar29 = (ulong)((uint)uVar28 & 0x1ffffff);
        lVar32 = uVar29 * 0x100;
        lVar30 = 0;
        do {
          auVar42 = *(undefined1 (*) [16])(auStack_8738 + uVar29 * 0x80 + lVar30);
          puVar11 = auStack_8638 + uVar29 * 0x80 + lVar30;
          auVar43 = *(undefined1 (*) [16])(auStack_8538 + lVar30 * 2 + lVar32);
          auVar70._0_12_ = auVar42._0_12_;
          auVar70._12_2_ = auVar42._6_2_;
          auVar70._14_2_ = puVar11[3];
          auVar46._12_4_ = auVar70._12_4_;
          auVar46._0_10_ = auVar42._0_10_;
          auVar46._10_2_ = puVar11[2];
          auVar63._10_6_ = auVar46._10_6_;
          auVar63._0_8_ = auVar42._0_8_;
          auVar63._8_2_ = auVar42._4_2_;
          auVar45._8_8_ = auVar63._8_8_;
          auVar45._6_2_ = puVar11[1];
          auVar45._4_2_ = auVar42._2_2_;
          auVar45._0_2_ = auVar42._0_2_;
          auVar45._2_2_ = *puVar11;
          puVar12 = auStack_8438 + uVar29 * 0x80 + lVar30;
          auVar69._0_12_ = auVar43._0_12_;
          auVar69._12_2_ = auVar43._6_2_;
          auVar69._14_2_ = puVar12[3];
          auVar68._12_4_ = auVar69._12_4_;
          auVar68._0_10_ = auVar43._0_10_;
          auVar68._10_2_ = puVar12[2];
          auVar67._10_6_ = auVar68._10_6_;
          auVar67._0_8_ = auVar43._0_8_;
          auVar67._8_2_ = auVar43._4_2_;
          auVar66._8_8_ = auVar67._8_8_;
          auVar66._6_2_ = puVar12[1];
          auVar66._4_2_ = auVar43._2_2_;
          auVar66._0_2_ = auVar43._0_2_;
          auVar66._2_2_ = *puVar12;
          auVar37 = *(undefined1 (*) [16])(auStack_8338 + lVar30 * 2 + lVar32);
          puVar13 = auStack_8238 + uVar29 * 0x80 + lVar30;
          auVar62._0_12_ = auVar37._0_12_;
          auVar62._12_2_ = auVar37._6_2_;
          auVar62._14_2_ = puVar13[3];
          auVar61._12_4_ = auVar62._12_4_;
          auVar61._0_10_ = auVar37._0_10_;
          auVar61._10_2_ = puVar13[2];
          auVar60._10_6_ = auVar61._10_6_;
          auVar60._0_8_ = auVar37._0_8_;
          auVar60._8_2_ = auVar37._4_2_;
          auVar59._8_8_ = auVar60._8_8_;
          auVar59._6_2_ = puVar13[1];
          auVar59._4_2_ = auVar37._2_2_;
          auVar59._0_2_ = auVar37._0_2_;
          auVar59._2_2_ = *puVar13;
          auVar55 = *(undefined1 (*) [16])(auStack_8138 + lVar30 * 2 + lVar32);
          puVar9 = local_8038 + uVar29 * 0x80 + lVar30;
          auVar47 = pmaddwd(auVar45,auVar65);
          auVar70 = pmaddwd(auVar66,auVar40);
          auVar51._0_12_ = auVar55._0_12_;
          auVar51._12_2_ = auVar55._6_2_;
          auVar51._14_2_ = puVar9[3];
          auVar50._12_4_ = auVar51._12_4_;
          auVar50._0_10_ = auVar55._0_10_;
          auVar50._10_2_ = puVar9[2];
          auVar49._10_6_ = auVar50._10_6_;
          auVar49._0_8_ = auVar55._0_8_;
          auVar49._8_2_ = auVar55._4_2_;
          auVar48._8_8_ = auVar49._8_8_;
          auVar48._6_2_ = puVar9[1];
          auVar48._4_2_ = auVar55._2_2_;
          auVar48._0_2_ = auVar55._0_2_;
          auVar48._2_2_ = *puVar9;
          auVar63 = pmaddwd(auVar59,auVar53);
          auVar56 = pmaddwd(auVar48,auVar64);
          auVar54._2_2_ = puVar11[4];
          auVar54._0_2_ = auVar42._8_2_;
          auVar54._4_2_ = auVar42._10_2_;
          auVar54._6_2_ = puVar11[5];
          auVar54._8_2_ = auVar42._12_2_;
          auVar54._10_2_ = puVar11[6];
          auVar54._12_2_ = auVar42._14_2_;
          auVar54._14_2_ = puVar11[7];
          auVar44._2_2_ = puVar12[4];
          auVar44._0_2_ = auVar43._8_2_;
          auVar44._4_2_ = auVar43._10_2_;
          auVar44._6_2_ = puVar12[5];
          auVar44._8_2_ = auVar43._12_2_;
          auVar44._10_2_ = puVar12[6];
          auVar44._12_2_ = auVar43._14_2_;
          auVar44._14_2_ = puVar12[7];
          auVar41._2_2_ = puVar13[4];
          auVar41._0_2_ = auVar37._8_2_;
          auVar41._4_2_ = auVar37._10_2_;
          auVar41._6_2_ = puVar13[5];
          auVar41._8_2_ = auVar37._12_2_;
          auVar41._10_2_ = puVar13[6];
          auVar41._12_2_ = auVar37._14_2_;
          auVar41._14_2_ = puVar13[7];
          auVar57._2_2_ = puVar9[4];
          auVar57._0_2_ = auVar55._8_2_;
          auVar57._4_2_ = auVar55._10_2_;
          auVar57._6_2_ = puVar9[5];
          auVar57._8_2_ = auVar55._12_2_;
          auVar57._10_2_ = puVar9[6];
          auVar57._12_2_ = auVar55._14_2_;
          auVar57._14_2_ = puVar9[7];
          auVar55 = pmaddwd(auVar54,auVar65);
          auVar37 = pmaddwd(auVar44,auVar40);
          auVar42 = pmaddwd(auVar41,auVar53);
          auVar58 = pmaddwd(auVar57,auVar64);
          auVar43 = ZEXT416((uint)conv_params->round_1);
          auVar39._0_4_ =
               auVar56._0_4_ + auVar63._0_4_ + auVar70._0_4_ + auVar47._0_4_ + iVar26 >> auVar43;
          auVar39._4_4_ =
               auVar58._0_4_ + auVar42._0_4_ + auVar37._0_4_ + auVar55._0_4_ + iVar26 >> auVar43;
          auVar39._8_4_ =
               auVar56._4_4_ + auVar63._4_4_ + auVar70._4_4_ + auVar47._4_4_ + iVar26 >> auVar43;
          auVar39._12_4_ =
               auVar58._4_4_ + auVar42._4_4_ + auVar37._4_4_ + auVar55._4_4_ + iVar26 >> auVar43;
          auVar52._0_4_ =
               auVar56._8_4_ + auVar63._8_4_ + auVar70._8_4_ + auVar47._8_4_ + iVar26 >> auVar43;
          auVar52._4_4_ =
               auVar58._8_4_ + auVar42._8_4_ + auVar37._8_4_ + auVar55._8_4_ + iVar26 >> auVar43;
          auVar52._8_4_ =
               auVar56._12_4_ + auVar63._12_4_ + auVar70._12_4_ + auVar47._12_4_ + iVar26 >> auVar43
          ;
          auVar52._12_4_ =
               auVar58._12_4_ + auVar42._12_4_ + auVar37._12_4_ + auVar55._12_4_ + iVar26 >> auVar43
          ;
          local_8748 = auVar38._0_2_;
          sStack_8746 = auVar38._2_2_;
          auVar42 = packssdw(auVar39,auVar52);
          sVar1 = (ushort)(-1 < auVar42._0_2_) * auVar42._0_2_;
          sVar8 = (ushort)(-1 < auVar42._2_2_) * auVar42._2_2_;
          sVar2 = (ushort)(-1 < auVar42._4_2_) * auVar42._4_2_;
          sVar7 = (ushort)(-1 < auVar42._6_2_) * auVar42._6_2_;
          sVar6 = (ushort)(-1 < auVar42._8_2_) * auVar42._8_2_;
          sVar5 = (ushort)(-1 < auVar42._10_2_) * auVar42._10_2_;
          sVar4 = (ushort)(-1 < auVar42._12_2_) * auVar42._12_2_;
          sVar3 = (ushort)(-1 < auVar42._14_2_) * auVar42._14_2_;
          puVar10 = (ushort *)(lVar27 + lVar30 * 2);
          *puVar10 = (ushort)(local_8748 < sVar1) * local_8748 |
                     (ushort)(local_8748 >= sVar1) * sVar1;
          puVar10[1] = (ushort)(sStack_8746 < sVar8) * sStack_8746 |
                       (ushort)(sStack_8746 >= sVar8) * sVar8;
          puVar10[2] = (ushort)(local_8748 < sVar2) * local_8748 |
                       (ushort)(local_8748 >= sVar2) * sVar2;
          puVar10[3] = (ushort)(sStack_8746 < sVar7) * sStack_8746 |
                       (ushort)(sStack_8746 >= sVar7) * sVar7;
          puVar10[4] = (ushort)(local_8748 < sVar6) * local_8748 |
                       (ushort)(local_8748 >= sVar6) * sVar6;
          puVar10[5] = (ushort)(sStack_8746 < sVar5) * sStack_8746 |
                       (ushort)(sStack_8746 >= sVar5) * sVar5;
          puVar10[6] = (ushort)(local_8748 < sVar4) * local_8748 |
                       (ushort)(local_8748 >= sVar4) * sVar4;
          puVar10[7] = (ushort)(sStack_8746 < sVar3) * sStack_8746 |
                       (ushort)(sStack_8746 >= sVar3) * sVar3;
          lVar30 = lVar30 + 8;
        } while (lVar30 < w);
      }
      uVar28 = uVar28 + 1;
      lVar27 = lVar27 + dst_stride * 2;
    } while (uVar28 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_ssse3(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        const __m128i maxval =
            _mm_set1_epi16((WIENER_CLAMP_LIMIT(conv_params->round_0, bd)) - 1);
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(_mm_max_epi16(res, zero), maxval);
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i maxval = _mm_set1_epi16((1 << bd) - 1);
        __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        res_16bit = _mm_min_epi16(_mm_max_epi16(res_16bit, zero), maxval);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storeu_si128(p, res_16bit);
      }
    }
  }
}